

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O0

JsrtDebuggerObjectBase *
JsrtDebuggerObjectFunction::Make
          (JsrtDebuggerObjectsManager *debuggerObjectsManager,JavascriptFunction *javascriptFunction
          )

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar4;
  JsrtDebuggerObjectFunction *this;
  TrackAllocData local_48;
  JsrtDebuggerObjectFunction *local_20;
  JsrtDebuggerObjectBase *debuggerObject;
  JavascriptFunction *javascriptFunction_local;
  JsrtDebuggerObjectsManager *debuggerObjectsManager_local;
  
  local_20 = (JsrtDebuggerObjectFunction *)0x0;
  debuggerObject = (JsrtDebuggerObjectBase *)javascriptFunction;
  javascriptFunction_local = (JavascriptFunction *)debuggerObjectsManager;
  bVar2 = JsrtDebuggerObjectsManager::TryGetDataFromDataToDebuggerObjectsDictionary
                    (debuggerObjectsManager,javascriptFunction,(JsrtDebuggerObjectBase **)&local_20)
  ;
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebuggerObject.cpp"
                       ,0x2ca,
                       "(!debuggerObjectsManager->TryGetDataFromDataToDebuggerObjectsDictionary(javascriptFunction, &debuggerObject))"
                       ,
                       "!debuggerObjectsManager->TryGetDataFromDataToDebuggerObjectsDictionary(javascriptFunction, &debuggerObject)"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pAVar4 = &JsrtDebuggerObjectsManager::GetDebugObjectArena
                      ((JsrtDebuggerObjectsManager *)javascriptFunction_local)->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebuggerObject.cpp"
             ,0x2cc);
  pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar4,&local_48);
  this = (JsrtDebuggerObjectFunction *)
         new<Memory::ArenaAllocator>(0x30,(ArenaAllocator *)pAVar4,0x3f67b0);
  JsrtDebuggerObjectFunction
            (this,(JsrtDebuggerObjectsManager *)javascriptFunction_local,
             (JavascriptFunction *)debuggerObject);
  local_20 = this;
  JsrtDebuggerObjectsManager::AddToDataToDebuggerObjectsDictionary
            ((JsrtDebuggerObjectsManager *)javascriptFunction_local,debuggerObject,
             (JsrtDebuggerObjectBase *)this);
  return &local_20->super_JsrtDebuggerObjectBase;
}

Assistant:

JsrtDebuggerObjectBase * JsrtDebuggerObjectFunction::Make(JsrtDebuggerObjectsManager * debuggerObjectsManager, Js::JavascriptFunction* javascriptFunction)
{
    JsrtDebuggerObjectBase* debuggerObject = nullptr;

    Assert(!debuggerObjectsManager->TryGetDataFromDataToDebuggerObjectsDictionary(javascriptFunction, &debuggerObject));
    
    debuggerObject = Anew(debuggerObjectsManager->GetDebugObjectArena(), JsrtDebuggerObjectFunction, debuggerObjectsManager, javascriptFunction);

    debuggerObjectsManager->AddToDataToDebuggerObjectsDictionary(javascriptFunction, debuggerObject);

    return debuggerObject;
}